

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

bool sb_reclaim_reusable_blocks(fdb_kvs_handle *handle)

{
  superblock *psVar1;
  bid_t count;
  __pointer_type __ptr;
  size_t sVar2;
  ulong val;
  uint8_t *bmp;
  bool bVar3;
  reusable_block *prVar4;
  long lVar5;
  stale_header_info stale_header;
  reusable_block_list rVar6;
  
  psVar1 = handle->file->sb;
  bVar3 = false;
  filemgr_sync(handle->file,false,&handle->log_callback);
  stale_header = fdb_get_smallest_active_header(handle);
  if (stale_header.bid != 0xffffffffffffffff) {
    rVar6 = fdb_get_reusable_block(handle,stale_header);
    sVar2 = rVar6.n_blocks;
    if (sVar2 == 0) {
      bVar3 = false;
    }
    else {
      val = (handle->file->pos).super___atomic_base<unsigned_long>._M_i /
            (ulong)handle->file->blocksize;
      if (val < 4) {
        fdb_assert_die("num_blocks >= SB_DEFAULT_NUM_SUPERBLOCKS",
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                       ,0x28c,val,4);
      }
      bmp = (uint8_t *)calloc(1,val + 7 >> 3);
      _free_bmp_idx(&psVar1->bmp_idx);
      lVar5 = 0;
      prVar4 = rVar6.blocks;
      do {
        sb_bmp_set(bmp,prVar4->bid,prVar4->count);
        if ((lVar5 == 0) &&
           ((psVar1->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i == 0xffffffffffffffff))
        {
          LOCK();
          (psVar1->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = prVar4->bid;
          UNLOCK();
        }
        count = prVar4->count;
        psVar1->num_free_blocks = psVar1->num_free_blocks + count;
        _add_bmp_idx(&psVar1->bmp_idx,prVar4->bid,count);
        lVar5 = lVar5 + 1;
        prVar4 = prVar4 + 1;
      } while (sVar2 + (sVar2 == 0) != lVar5);
      free(rVar6.blocks);
      pthread_spin_lock(&psVar1->bmp_lock);
      LOCK();
      (psVar1->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
           (psVar1->bmp_wcount).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      do {
      } while ((psVar1->bmp_rcount).super___atomic_base<unsigned_long>._M_i != 0);
      __ptr = (psVar1->bmp)._M_b._M_p;
      (psVar1->bmp)._M_b._M_p = bmp;
      LOCK();
      (psVar1->bmp_size).super___atomic_base<unsigned_long>._M_i = val;
      UNLOCK();
      psVar1->min_live_hdr_revnum = stale_header.revnum;
      psVar1->min_live_hdr_bid = stale_header.bid;
      LOCK();
      (psVar1->bmp_revnum).super___atomic_base<unsigned_long>._M_i =
           (psVar1->bmp_revnum).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      psVar1->num_init_free_blocks = psVar1->num_free_blocks;
      LOCK();
      (psVar1->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
           (psVar1->bmp_wcount).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      pthread_spin_unlock(&psVar1->bmp_lock);
      free(__ptr);
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool sb_reclaim_reusable_blocks(fdb_kvs_handle *handle)
{
    size_t i;
    uint64_t num_blocks, bmp_size_byte;
    stale_header_info sheader;
    reusable_block_list blist;
    struct superblock *sb = handle->file->sb;

    // should flush all dirty blocks in cache
    filemgr_sync(handle->file, false, &handle->log_callback);

    sheader = fdb_get_smallest_active_header(handle);
    if (sheader.bid == BLK_NOT_FOUND) {
        return false;
    }

    // get reusable block list
    blist = fdb_get_reusable_block(handle, sheader);
    if (blist.n_blocks == 0) {
        return false;
    }

    // update superblock's bitmap
    uint8_t *new_bmp = NULL, *old_bmp = NULL;
    num_blocks = filemgr_get_pos(handle->file) / handle->file->blocksize;
    // 8 bitmaps per byte
    bmp_size_byte = (num_blocks+7) / 8;
    fdb_assert(num_blocks >= SB_DEFAULT_NUM_SUPERBLOCKS,
               num_blocks, SB_DEFAULT_NUM_SUPERBLOCKS);
    new_bmp = (uint8_t*)calloc(1, bmp_size_byte);

    // free pre-existing bmp index
    _free_bmp_idx(&sb->bmp_idx);

    for (i=0; i<blist.n_blocks; ++i) {
        sb_bmp_set(new_bmp, blist.blocks[i].bid, blist.blocks[i].count);
        if (i==0 &&
            atomic_get_uint64_t(&sb->cur_alloc_bid) == BLK_NOT_FOUND) {
            atomic_store_uint64_t(&sb->cur_alloc_bid, blist.blocks[i].bid);
        }
        sb->num_free_blocks += blist.blocks[i].count;
        // add info for supplementary bmp index
        _add_bmp_idx(&sb->bmp_idx, blist.blocks[i].bid, blist.blocks[i].count);
    }
    free(blist.blocks);

    sb_bmp_change_begin(sb);
    old_bmp = sb->bmp.load(std::memory_order_relaxed);
    sb->bmp.store(new_bmp, std::memory_order_relaxed);
    atomic_store_uint64_t(&sb->bmp_size, num_blocks);
    sb->min_live_hdr_revnum = sheader.revnum;
    sb->min_live_hdr_bid = sheader.bid;
    atomic_incr_uint64_t(&sb->bmp_revnum);
    sb->num_init_free_blocks = sb->num_free_blocks;
    sb_bmp_change_end(sb);
    free(old_bmp);

    return true;
}